

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  int local_3c;
  int local_38;
  int n_p;
  int n_d;
  Helper h;
  
  local_3c = 0;
  local_38 = 0;
  std::operator<<((ostream *)&std::cout,"\nPlease input program size: ");
  std::istream::operator>>((istream *)&std::cin,&local_3c);
  std::operator<<((ostream *)&std::cout,"\nPlease input data size: ");
  std::istream::operator>>((istream *)&std::cin,&local_38);
  if (local_38 < 1 || local_3c < 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"\nInvalid input! Terminating...");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    Helper::Helper((Helper *)&n_p,local_3c,local_38,1000);
    Helper::Init((Helper *)&n_p);
    Helper::~Helper((Helper *)&n_p);
  }
  return 0;
}

Assistant:

int main(int argc, char const *argv[]) 
{ 
	int n_p = 0;
    int n_d = 0;
    cout<<"\nPlease input program size: ";
    cin>> n_p;
    cout<<"\nPlease input data size: ";
    cin>> n_d;
    if(n_p > 0 && n_d > 0)
    {
        Helper h(n_p, n_d, 1000);
	    h.Init();
    }
    else
        cout<<"\nInvalid input! Terminating..."<<endl;
        
	return 0; 
}